

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu2_v2.c
# Opt level: O1

MPP_RET hal_h264e_vepu2_gen_regs_v2(void *hal,HalEncTask *task)

{
  ushort uVar1;
  int iVar2;
  EncRcTask *pEVar3;
  long lVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  RK_S32 RVar8;
  size_t sVar9;
  void *pvVar10;
  ulong uVar11;
  MppBuffer pvVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  RK_U8 dmv_qpel_penalty [128];
  RK_U8 dmv_penalty [128];
  uint auStack_698 [32];
  uint auStack_618 [294];
  undefined8 uStack_180;
  uint local_16c;
  ulong local_168;
  int *local_160;
  EncRcTask *local_158;
  int *local_150;
  long local_148;
  ulong local_140;
  uint local_138 [32];
  uint local_b8 [34];
  
  pEVar3 = task->rc_task;
  local_150 = *(int **)((long)hal + 0x260);
  local_160 = *(int **)((long)hal + 0x268);
  lVar4 = *(long *)((long)hal + 0x270);
  uVar17 = local_150[0xf];
  local_168 = (ulong)(uint)local_150[0x10];
  uStack_180 = 0x233418;
  sVar9 = mpp_packet_get_length(task->packet);
  if (*(int *)((long)hal + 0x144) != 0) {
    local_168 = (ulong)*(uint *)(*(long *)((long)hal + 0x260) + 0x3c);
    uVar17 = *(uint *)(*(long *)((long)hal + 0x260) + 0x40);
  }
  local_140 = (ulong)uVar17;
  *(RK_S32 *)((long)hal + 0x198) = (pEVar3->info).quality_target;
  *(RK_S32 *)((long)hal + 0x1a0) = (pEVar3->info).quality_max;
  *(RK_S32 *)((long)hal + 0x19c) = (pEVar3->info).quality_min;
  if (((byte)hal_h264e_debug & 2) != 0) {
    uStack_180 = 0x233490;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter %p\n","hal_h264e_vepu2_gen_regs_v2",hal);
  }
  if (((byte)hal_h264e_debug & 8) != 0) {
    uStack_180 = 0x2334cc;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","frame %d generate regs now","hal_h264e_vepu2_gen_regs_v2",
               (ulong)*(ushort *)((long)&pEVar3->frm + 6));
  }
  uStack_180 = 0x2334e4;
  local_158 = pEVar3;
  h264e_vepu_mbrc_prepare
            (*(HalH264eVepuMbRcCtx *)((long)hal + 0x2f8),(HalH264eVepuMbRc *)((long)hal + 0x198),
             task->rc_task);
  uStack_180 = 0x2334fa;
  h264e_vepu_slice_split_cfg
            (*(H264eSlice **)((long)hal + 0x270),(HalH264eVepuMbRc *)((long)hal + 0x198),
             task->rc_task,*hal);
  pvVar12 = task->output;
  uStack_180 = 0x23350d;
  local_16c = mpp_buffer_get_fd_with_caller(pvVar12,"setup_output_packet");
  uVar17 = (uint)sVar9;
  local_148 = lVar4;
  if (uVar17 == 0) {
    uVar15 = 0;
    uVar19 = 0;
  }
  else {
    uStack_180 = 0x23352a;
    pvVar10 = mpp_buffer_get_ptr_with_caller(pvVar12,"setup_output_packet");
    uVar15 = *(uint *)((long)pvVar10 + (ulong)(uVar17 & 0xfffffff8));
    uVar18 = *(uint *)((long)pvVar10 + (ulong)(uVar17 & 0xfffffff8) + 4);
    uVar19 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
    uVar15 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  }
  uVar18 = uVar17 & 0xfffffff8;
  if (((byte)hal_h264e_debug & 8) != 0) {
    uStack_180 = 0x23357e;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","offset %d offset8 %d\n","setup_output_packet",
               sVar9 & 0xffffffff,(ulong)uVar18);
  }
  *(uint *)((long)hal + 0x434) = local_16c;
  uStack_180 = 0x233599;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x4d,uVar18);
  uStack_180 = 0x2335a8;
  sVar9 = mpp_buffer_get_size_with_caller(pvVar12,"setup_output_packet");
  *(uint *)((long)hal + 0x3d4) = (int)sVar9 - uVar18 >> 3 & 0xfffffff8;
  if (((byte)hal_h264e_debug & 8) != 0) {
    uStack_180 = 0x2335ea;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","msb %08x lsb %08x","setup_output_packet",(ulong)uVar19,
               (ulong)uVar15);
  }
  *(uint *)((long)hal + 0x3cc) = uVar19;
  *(uint *)((long)hal + 0x3d0) = uVar15;
  uVar19 = uVar17 * 8 & 0x38;
  *(uint *)((long)hal + 0x214) = uVar17;
  *(uint *)((long)hal + 0x218) = uVar19 >> 3;
  *(undefined4 *)((long)hal + 0x21c) = 0;
  uVar17 = *(uint *)(*(long *)((long)hal + 0x260) + 0x3c);
  uVar15 = *(uint *)(*(long *)((long)hal + 0x260) + 0x40);
  iVar7 = *(int *)(*hal + 0x16c);
  uVar1 = *(ushort *)((long)&local_158->frm + 6);
  iVar14 = *(int *)(*hal + 0xc4);
  if (((byte)hal_h264e_debug & 2) != 0) {
    uStack_180 = 0x233682;
    local_16c = uVar15;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter\n","setup_intra_refresh");
    uVar15 = local_16c;
  }
  uVar18 = 0;
  if ((*(int *)(*hal + 0x164) == 0) || (((local_158->frm).val & 0x4000000000) == 0)) {
    uVar16 = 0;
    uVar6 = 0;
  }
  else {
    iVar2 = *(int *)(*hal + 0x168);
    iVar14 = (int)((long)(ulong)uVar1 % (long)iVar14);
    if (iVar2 == 1) {
      uVar13 = iVar14 * iVar7 - 2;
      uVar16 = (iVar14 + 1) * iVar7 - 1;
      uVar18 = uVar17;
      if ((int)uVar13 < (int)uVar17) {
        uVar18 = uVar13;
      }
      if ((int)uVar16 < (int)uVar17) {
        uVar17 = uVar16;
      }
      if ((int)uVar16 < 0) {
        uVar17 = 0;
      }
      uVar6 = (uVar18 & 0xff) << 8;
      uVar16 = uVar15;
    }
    else {
      uVar16 = 0;
      uVar6 = 0;
      if (iVar2 != 0) goto LAB_00233723;
      uVar13 = iVar14 * iVar7 - 2;
      uVar18 = (iVar14 + 1) * iVar7 - 1;
      uVar6 = uVar15;
      if ((int)uVar13 < (int)uVar15) {
        uVar6 = uVar13;
      }
      uVar6 = uVar6 << 0x18;
      if ((int)uVar18 < (int)uVar15) {
        uVar15 = uVar18;
      }
      uVar16 = uVar15;
      if ((int)uVar18 < 0) {
        uVar16 = 0;
      }
    }
    uVar18 = uVar17;
    if ((int)uVar13 < 0) {
      uVar6 = 0;
    }
  }
LAB_00233723:
  *(uint *)((long)hal + 0x3b8) = uVar18 & 0xff | uVar6 | (uVar16 & 0xff) << 0x10;
  if (((byte)hal_h264e_debug & 2) != 0) {
    uStack_180 = 0x23376d;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave, ret %d\n","setup_intra_refresh",0);
  }
  lVar4 = local_148;
  *(undefined4 *)((long)hal + 0x3d8) = 0x1000;
  *(undefined4 *)((long)hal + 0x3dc) = *(undefined4 *)((long)hal + 0x208);
  uVar17 = (uint)local_140;
  iVar14 = (*(uint *)(local_148 + 0x40) & 3) * 0x200000;
  iVar7 = iVar14 + 0x100000;
  if (local_160[2] == 0) {
    iVar7 = iVar14;
  }
  uVar18 = iVar7 + (uint)(0xe10 < uVar17 * (int)local_168) * 0x10000000;
  uVar15 = uVar18 + 0x20000;
  if (local_160[0x11] == 0) {
    uVar15 = uVar18;
  }
  uVar18 = uVar15 + 0x10000;
  if (*local_150 < 0x20) {
    uVar18 = uVar15;
  }
  *(uint *)((long)hal + 0x3ec) = (*(uint *)((long)hal + 0x210) & 0x7f) << 8 | uVar18;
  uVar15 = uVar17 + (int)local_168;
  iVar7 = 1;
  if (uVar15 < 0xc9) {
    iVar7 = (int)(200 / (ulong)uVar15);
  }
  iVar14 = *(int *)((long)hal + 0x198);
  uVar15 = 0xff00;
  if (iVar7 * h264_skip_sad_penalty[iVar14] < 0xff) {
    uVar15 = iVar7 * h264_skip_sad_penalty[iVar14] * 0x100;
  }
  uVar18 = (-*(uint *)((long)hal + 0xe4) & 0xc) << 2;
  if ((*(uint *)((long)hal + 0xe4) & 0xf) == 0) {
    uVar18 = 0;
  }
  uVar16 = -*(uint *)((long)hal + 0xe8) & 0xf;
  if ((*(uint *)((long)hal + 0xe8) & 0xf) == 0) {
    uVar16 = 0;
  }
  *(uint *)((long)hal + 0x3f0) = uVar19 << 0x10 | uVar15 | uVar18 | uVar16;
  *(uint *)((long)hal + 0x3f4) = *(uint *)((long)hal + 0x108) & 0x3fff;
  *(uint *)((long)hal + 0x404) =
       (uint)*(ushort *)((long)hal + 0x1ac) | *(int *)((long)hal + 0x1a8) << 0x10;
  *(uint *)((long)hal + 0x408) =
       (uint)*(ushort *)((long)hal + 0x1b4) | *(int *)((long)hal + 0x1b0) << 0x10;
  *(uint *)((long)hal + 0x40c) =
       (uint)*(ushort *)((long)hal + 0x1bc) | *(int *)((long)hal + 0x1b8) << 0x10;
  *(uint *)((long)hal + 0x410) =
       (uint)*(ushort *)((long)hal + 0x1c4) | *(int *)((long)hal + 0x1c0) << 0x10;
  *(uint *)((long)hal + 0x414) =
       (uint)*(ushort *)((long)hal + 0x1cc) | *(int *)((long)hal + 0x1c8) << 0x10;
  *(uint *)((long)hal + 0x418) =
       (uint)*(ushort *)((long)hal + 0x1d4) | *(int *)((long)hal + 0x1d0) << 0x10;
  *(uint *)((long)hal + 0x41c) =
       (uint)*(ushort *)((long)hal + 0x1dc) | *(int *)((long)hal + 0x1d8) << 0x10;
  *(uint *)((long)hal + 0x420) =
       (uint)*(ushort *)((long)hal + 0x1e4) | *(int *)((long)hal + 0x1e0) << 0x10;
  *(uint *)((long)hal + 0x424) =
       *(uint *)((long)hal + 0x1ec) & 0xf |
       (*(uint *)((long)hal + 0x1f0) & 0xf) << 4 |
       (*(uint *)((long)hal + 500) & 0xf) << 8 |
       (*(uint *)((long)hal + 0x1f8) & 0xf) << 0xc |
       (*(uint *)((long)hal + 0x1fc) & 0xf) << 0x10 |
       (*(uint *)((long)hal + 0x200) & 0xf) << 0x14 | (*(uint *)((long)hal + 0x204) & 0xf) << 0x18;
  *(uint *)((long)hal + 0x428) =
       ((*(uint *)((long)hal + 0xe0) & 0xf) << 4 | (*(uint *)((long)hal + 0x20c) & 0x3f) << 0x18) +
       (*(uint *)((long)hal + 0x144) & 3) * 4 + 1;
  *(uint *)((long)hal + 0x42c) =
       (uint)(ushort)h264_inter_favor[iVar14] | h264_intra16_favor[iVar14] << 0x10;
  uVar18 = (local_160[0xb] & 0x1fU) << 0xd |
           (*(uint *)(local_148 + 0x4c) & 0xf) << 0x12 |
           (*(uint *)(local_148 + 0x48) & 0xf) << 0x16 | local_160[9] << 0x1a;
  uVar19 = *(uint *)(local_148 + 0x6c) & 0xf;
  uVar15 = uVar18 + 0x20 + uVar19 * 2;
  if (*(int *)(local_148 + 0x44) == 0) {
    uVar15 = uVar18 + uVar19 * 2;
  }
  *(uint *)((long)hal + 0x430) = local_160[0xf] != 0 | uVar15;
  *(undefined8 *)((long)hal + 0x43c) = 0;
  if (*(MppBuffer *)((long)hal + 0x28) == (MppBuffer)0x0) {
    iVar7 = 0;
  }
  else {
    uStack_180 = 0x233a70;
    iVar7 = mpp_buffer_get_fd_with_caller
                      (*(MppBuffer *)((long)hal + 0x28),"hal_h264e_vepu2_gen_regs_v2");
  }
  *(int *)((long)hal + 0x444) = iVar7;
  uVar15 = (uVar17 & 0xff) << 8 | ((uint)local_168 & 0xff) * 0x1010000 | uVar17 & 0xff;
  *(uint *)((long)hal + 0x448) = uVar15;
  *(uint *)((long)hal + 0x44c) = uVar15;
  *(undefined4 *)((long)hal + 0x478) = 0;
  *(uint *)((long)hal + 0x47c) =
       (uint)*(ushort *)((long)hal + 0x130) | *(int *)((long)hal + 0x134) << 0x10;
  *(uint *)((long)hal + 0x480) =
       (uint)*(ushort *)((long)hal + 0x138) | *(int *)((long)hal + 0x13c) << 0x10;
  *(uint *)((long)hal + 0x484) = (uint)*(ushort *)((long)hal + 0x140);
  *(uint *)((long)hal + 0x488) =
       *(byte *)((long)hal + 0x128) & 0x1f |
       (*(byte *)((long)hal + 0x129) & 0x1f) << 8 | (*(byte *)((long)hal + 0x12a) & 0x1f) << 0x10;
  iVar7 = *(int *)((long)hal + 0x198);
  *(RK_U32 *)((long)hal + 0x48c) =
       (h264_diff_mv_penalty[iVar7] & 0x3ff) * 0x200800 +
       (h264_diff_mv_penalty4p[iVar7] & 0x3ff) * 2 + 1;
  *(uint *)((long)hal + 0x490) =
       *(uint *)((long)hal + 0x1a4) & 0xfff |
       (*(uint *)((long)hal + 0x19c) & 0x3f) << 0xe |
       (*(uint *)((long)hal + 0x1a0) & 0x3f) << 0x14 | iVar7 << 0x1a;
  *(undefined4 *)((long)hal + 0x498) = 0xa00000;
  *(uint *)((long)hal + 0x4a4) =
       (*(byte *)((long)hal + 0x12d) & 1) * 0x20000000 +
       ((*(byte *)((long)hal + 300) & 1) << 0x1e | (uint)*(byte *)((long)hal + 299) << 0x1f) +
       0x1c000000;
  *(uint *)((long)hal + 0x4a8) =
       (uint)*(ushort *)(lVar4 + 0x34) |
       (h264_prev_mode_favor[iVar7] & 0xff) << 0x10 | *local_160 << 0x18;
  *(undefined4 *)((long)hal + 0x4b4) = 0x400;
  local_b8[0x1c] = 0;
  local_b8[0x1d] = 0;
  local_b8[0x1e] = 0;
  local_b8[0x1f] = 0;
  local_b8[0x18] = 0;
  local_b8[0x19] = 0;
  local_b8[0x1a] = 0;
  local_b8[0x1b] = 0;
  local_b8[0x14] = 0;
  local_b8[0x15] = 0;
  local_b8[0x16] = 0;
  local_b8[0x17] = 0;
  local_b8[0x10] = 0;
  local_b8[0x11] = 0;
  local_b8[0x12] = 0;
  local_b8[0x13] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  lVar20 = 0;
  do {
    *(char *)((long)local_b8 + lVar20) = (char)lVar20;
    uStack_180 = 0x233c79;
    RVar8 = exp_golomb_signed((RK_S32)lVar20);
    uVar5 = 0xff;
    if (RVar8 < 0xff) {
      uStack_180 = 0x233c8d;
      RVar8 = exp_golomb_signed((RK_S32)lVar20);
      uVar5 = (undefined1)RVar8;
    }
    *(undefined1 *)((long)local_138 + lVar20) = uVar5;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x80);
  lVar20 = 0x560;
  do {
    uVar15 = *(uint *)((long)auStack_618 + lVar20);
    *(uint *)((long)hal + lVar20 + -0x80) =
         uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
    uVar15 = *(uint *)((long)auStack_698 + lVar20);
    *(uint *)((long)hal + lVar20) =
         uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
    uVar11 = lVar20 - 0x560;
    lVar20 = lVar20 + 4;
  } while (uVar11 < 0x7c);
  *(undefined4 *)((long)hal + 0x3c0) = *(undefined4 *)((long)hal + 0x148);
  if (*(RK_U32 *)((long)hal + 0x180) != 0) {
    uStack_180 = 0x233cf3;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x30,*(RK_U32 *)((long)hal + 0x180));
  }
  *(undefined4 *)((long)hal + 0x3c4) = *(undefined4 *)((long)hal + 0x14c);
  if (*(RK_U32 *)((long)hal + 0x184) != 0) {
    uStack_180 = 0x233d17;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x31,*(RK_U32 *)((long)hal + 0x184));
  }
  *(undefined4 *)((long)hal + 0x3c8) = *(undefined4 *)((long)hal + 0x150);
  if (*(RK_U32 *)((long)hal + 0x188) != 0) {
    uStack_180 = 0x233d3b;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x32,*(RK_U32 *)((long)hal + 0x188));
  }
  uStack_180 = 0x233d43;
  pvVar12 = h264e_vepu_buf_get_nal_size_table((HalH264eVepuBufs *)((long)hal + 0x18));
  if (pvVar12 == (MppBuffer)0x0) {
    iVar7 = 0;
  }
  else {
    uStack_180 = 0x233d57;
    iVar7 = mpp_buffer_get_fd_with_caller(pvVar12,"hal_h264e_vepu2_gen_regs_v2");
  }
  *(int *)((long)hal + 0x438) = iVar7;
  *(undefined8 *)((long)hal + 0x3fc) = *(undefined8 *)((long)hal + 0x154);
  uStack_180 = 0x233d80;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x40,*(RK_U32 *)((long)hal + 0x48));
  *(undefined8 *)((long)hal + 0x3e0) = *(undefined8 *)((long)hal + 0x15c);
  uStack_180 = 0x233d9f;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x39,*(RK_U32 *)((long)hal + 0x48));
  *(uint *)((long)hal + 0x49c) =
       (*(uint *)(lVar4 + 0x68) & 3) * 0x40 +
       ((uVar17 & 0x1ff) << 8 | ((uint)local_168 & 0x1ff) << 0x14) + 0x31;
  *(int *)((long)hal + 0x10) = *(int *)((long)hal + 0x10) + 1;
  if (((byte)hal_h264e_debug & 2) != 0) {
    uStack_180 = 0x233e03;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave %p\n","hal_h264e_vepu2_gen_regs_v2",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu2_gen_regs_v2(void *hal, HalEncTask *task)
{
    //MPP_RET ret = MPP_OK;
    HalH264eVepu2Ctx *ctx = (HalH264eVepu2Ctx *)hal;
    HalH264eVepuBufs *hw_bufs = &ctx->hw_bufs;
    HalH264eVepuPrep *hw_prep = &ctx->hw_prep;
    HalH264eVepuAddr *hw_addr = &ctx->hw_addr;
    HalH264eVepuMbRc *hw_mbrc = &ctx->hw_mbrc;
    VepuOffsetCfg *hw_offset = &ctx->hw_offset;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    EncFrmStatus *frm = &task->rc_task->frm;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    RK_U32 *reg = ctx->regs_set.val;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 offset = mpp_packet_get_length(task->packet);
    RK_U32 first_free_bit = 0;
    RK_U32 val = 0;
    RK_S32 i = 0;

    if (hw_prep->rotation) {
        mb_w = ctx->sps->pic_height_in_mbs;
        mb_h = ctx->sps->pic_width_in_mbs;
    }

    hw_mbrc->qp_init = rc_info->quality_target;
    hw_mbrc->qp_max = rc_info->quality_max;
    hw_mbrc->qp_min = rc_info->quality_min;

    hal_h264e_dbg_func("enter %p\n", hal);

    hal_h264e_dbg_detail("frame %d generate regs now", frm->seq_idx);

    // prepare mb rc config
    h264e_vepu_mbrc_prepare(ctx->rc_ctx, &ctx->hw_mbrc, task->rc_task);
    h264e_vepu_slice_split_cfg(ctx->slice, &ctx->hw_mbrc, task->rc_task, ctx->cfg);

    /* setup output address with offset */
    first_free_bit = setup_output_packet(ctx, reg, task->output, offset);

    /* set extra byte for header */
    hw_mbrc->hdr_strm_size = offset;
    hw_mbrc->hdr_free_size = first_free_bit / 8;
    hw_mbrc->out_strm_size = 0;

    /*
     * The hardware needs only the value for luma plane, because
     * values of other planes are calculated internally based on
     * format setting.
     */
    setup_intra_refresh(ctx, frm);

    val = VEPU_REG_AXI_CTRL_READ_ID(0);
    val |= VEPU_REG_AXI_CTRL_WRITE_ID(0);
    val |= VEPU_REG_AXI_CTRL_BURST_LEN(16);
    val |= VEPU_REG_AXI_CTRL_INCREMENT_MODE(0);
    val |= VEPU_REG_AXI_CTRL_BIRST_DISCARD(0);
    H264E_HAL_SET_REG(reg, VEPU_REG_AXI_CTRL, val);

    H264E_HAL_SET_REG(reg, VEPU_QP_ADJUST_MAD_DELTA_ROI,
                      hw_mbrc->mad_qp_change);

    val = 0;
    if (mb_w * mb_h > 3600)
        val = VEPU_REG_DISABLE_QUARTER_PIXEL_MV;
    val |= VEPU_REG_CABAC_INIT_IDC(slice->cabac_init_idc);
    if (pps->entropy_coding_mode)
        val |= VEPU_REG_ENTROPY_CODING_MODE;
    if (pps->transform_8x8_mode)
        val |= VEPU_REG_H264_TRANS8X8_MODE;
    if (sps->profile_idc > 31)
        val |= VEPU_REG_H264_INTER4X4_MODE;
    /*reg |= VEPU_REG_H264_STREAM_MODE;*/
    val |= VEPU_REG_H264_SLICE_SIZE(hw_mbrc->slice_size_mb_rows);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL0, val);

    RK_U32 scaler = MPP_MAX(1, 200 / (mb_w + mb_h));

    RK_U32 skip_penalty = MPP_MIN(255, h264_skip_sad_penalty[hw_mbrc->qp_init] * scaler);

    RK_U32 overfill_r = (hw_prep->src_w & 0x0f) ?
                        ((16 - (hw_prep->src_w & 0x0f)) / 4) : 0;

    RK_U32 overfill_b = (hw_prep->src_h & 0x0f) ?
                        (16 - (hw_prep->src_h & 0x0f)) : 0;

    val = VEPU_REG_STREAM_START_OFFSET(first_free_bit) |
          VEPU_REG_SKIP_MACROBLOCK_PENALTY(skip_penalty) |
          VEPU_REG_IN_IMG_CTRL_OVRFLR_D4(overfill_r) |
          VEPU_REG_IN_IMG_CTRL_OVRFLB(overfill_b);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_OVER_FILL_STRM_OFFSET, val);

    // When offset is zero row length should be total 16 aligned width
    val = VEPU_REG_IN_IMG_CHROMA_OFFSET(0)
          | VEPU_REG_IN_IMG_LUMA_OFFSET(0)
          | VEPU_REG_IN_IMG_CTRL_ROW_LEN(hw_prep->pixel_stride);

    H264E_HAL_SET_REG(reg, VEPU_REG_INPUT_LUMA_INFO, val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[0])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(0), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[2])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[3]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(1), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[4])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[5]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(2), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[6])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[7]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(3), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[8])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[9]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(4), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[0])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(0), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[2])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[3]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(1), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[4])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[5]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(2), val);

    val = VEPU_REG_CHKPT_DELTA_QP_CHK6(hw_mbrc->cp_delta_qp[6])
          | VEPU_REG_CHKPT_DELTA_QP_CHK5(hw_mbrc->cp_delta_qp[5])
          | VEPU_REG_CHKPT_DELTA_QP_CHK4(hw_mbrc->cp_delta_qp[4])
          | VEPU_REG_CHKPT_DELTA_QP_CHK3(hw_mbrc->cp_delta_qp[3])
          | VEPU_REG_CHKPT_DELTA_QP_CHK2(hw_mbrc->cp_delta_qp[2])
          | VEPU_REG_CHKPT_DELTA_QP_CHK1(hw_mbrc->cp_delta_qp[1])
          | VEPU_REG_CHKPT_DELTA_QP_CHK0(hw_mbrc->cp_delta_qp[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_DELTA_QP, val);

    val = VEPU_REG_MAD_THRESHOLD(hw_mbrc->mad_threshold)
          | VEPU_REG_IN_IMG_CTRL_FMT(hw_prep->src_fmt)
          | VEPU_REG_IN_IMG_ROTATE_MODE(hw_prep->rotation)
          | VEPU_REG_SIZE_TABLE_PRESENT; //FIXED
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL1, val);

    val = VEPU_REG_INTRA16X16_MODE(h264_intra16_favor[hw_mbrc->qp_init])
          | VEPU_REG_INTER_MODE(h264_inter_favor[hw_mbrc->qp_init]);
    H264E_HAL_SET_REG(reg, VEPU_REG_INTRA_INTER_MODE, val);

    val = VEPU_REG_PPS_INIT_QP(pps->pic_init_qp)
          | VEPU_REG_SLICE_FILTER_ALPHA(slice->slice_alpha_c0_offset_div2)
          | VEPU_REG_SLICE_FILTER_BETA(slice->slice_beta_offset_div2)
          | VEPU_REG_CHROMA_QP_OFFSET(pps->chroma_qp_index_offset)
          | VEPU_REG_IDR_PIC_ID(slice->idr_pic_id);

    if (slice->disable_deblocking_filter_idc)
        val |= VEPU_REG_FILTER_DISABLE;

    if (pps->constrained_intra_pred)
        val |= VEPU_REG_CONSTRAINED_INTRA_PREDICTION;
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL2, val);

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_NEXT_PIC, 0);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_MV_OUT, 0);

    MppBuffer cabac_table = hw_bufs->cabac_table;
    RK_S32 cabac_table_fd = cabac_table ? mpp_buffer_get_fd(cabac_table) : 0;

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_CABAC_TBL, cabac_table_fd);

    val = VEPU_REG_ROI1_TOP_MB(mb_h)
          | VEPU_REG_ROI1_BOTTOM_MB(mb_h)
          | VEPU_REG_ROI1_LEFT_MB(mb_w)
          | VEPU_REG_ROI1_RIGHT_MB(mb_w);
    H264E_HAL_SET_REG(reg, VEPU_REG_ROI1, val);

    val = VEPU_REG_ROI2_TOP_MB(mb_h)
          | VEPU_REG_ROI2_BOTTOM_MB(mb_h)
          | VEPU_REG_ROI2_LEFT_MB(mb_w)
          | VEPU_REG_ROI2_RIGHT_MB(mb_w);
    H264E_HAL_SET_REG(reg, VEPU_REG_ROI2, val);
    H264E_HAL_SET_REG(reg, VEPU_REG_STABLILIZATION_OUTPUT, 0);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFB(hw_prep->color_conversion_coeff_b)
          | VEPU_REG_RGB2YUV_CONVERSION_COEFA(hw_prep->color_conversion_coeff_a);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF1, val);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFE(hw_prep->color_conversion_coeff_e)
          | VEPU_REG_RGB2YUV_CONVERSION_COEFC(hw_prep->color_conversion_coeff_c);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF2, val);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFF(hw_prep->color_conversion_coeff_f);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF3, val);

    val = VEPU_REG_RGB_MASK_B_MSB(hw_prep->b_mask_msb)
          | VEPU_REG_RGB_MASK_G_MSB(hw_prep->g_mask_msb)
          | VEPU_REG_RGB_MASK_R_MSB(hw_prep->r_mask_msb);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB_MASK_MSB, val); //FIXED

    {
        RK_U32 diff_mv_penalty[3] = {0};
        diff_mv_penalty[0] = h264_diff_mv_penalty4p[hw_mbrc->qp_init];
        diff_mv_penalty[1] = h264_diff_mv_penalty[hw_mbrc->qp_init];
        diff_mv_penalty[2] = h264_diff_mv_penalty[hw_mbrc->qp_init];

        val = VEPU_REG_1MV_PENALTY(diff_mv_penalty[1])
              | VEPU_REG_QMV_PENALTY(diff_mv_penalty[2])
              | VEPU_REG_4MV_PENALTY(diff_mv_penalty[0]);
    }

    val |= VEPU_REG_SPLIT_MV_MODE_EN;
    H264E_HAL_SET_REG(reg, VEPU_REG_MV_PENALTY, val);

    val = VEPU_REG_H264_LUMA_INIT_QP(hw_mbrc->qp_init)
          | VEPU_REG_H264_QP_MAX(hw_mbrc->qp_max)
          | VEPU_REG_H264_QP_MIN(hw_mbrc->qp_min)
          | VEPU_REG_H264_CHKPT_DISTANCE(hw_mbrc->cp_distance_mbs);
    H264E_HAL_SET_REG(reg, VEPU_REG_QP_VAL, val);

    val = VEPU_REG_ZERO_MV_FAVOR_D2(10);
    H264E_HAL_SET_REG(reg, VEPU_REG_MVC_RELATE, val);

    val = VEPU_REG_OUTPUT_SWAP32
          | VEPU_REG_OUTPUT_SWAP16
          | VEPU_REG_OUTPUT_SWAP8
          | VEPU_REG_INPUT_SWAP8_(hw_prep->swap_8_in)
          | VEPU_REG_INPUT_SWAP16_(hw_prep->swap_16_in)
          | VEPU_REG_INPUT_SWAP32_(hw_prep->swap_32_in);
    H264E_HAL_SET_REG(reg, VEPU_REG_DATA_ENDIAN, val);

    val = VEPU_REG_PPS_ID(pps->pps_id)
          | VEPU_REG_INTRA_PRED_MODE(h264_prev_mode_favor[hw_mbrc->qp_init])
          | VEPU_REG_FRAME_NUM(slice->frame_num);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL3, val);

    val = VEPU_REG_INTERRUPT_TIMEOUT_EN;
    H264E_HAL_SET_REG(reg, VEPU_REG_INTERRUPT, val);

    {
        RK_U8 dmv_penalty[128] = {0};
        RK_U8 dmv_qpel_penalty[128] = {0};

        for (i = 0; i < 128; i++) {
            dmv_penalty[i] = i;
            dmv_qpel_penalty[i] = MPP_MIN(255, exp_golomb_signed(i));
        }

        for (i = 0; i < 128; i += 4) {
            val = VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i], 3);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 1], 2);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 2], 1);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 3], 0);
            H264E_HAL_SET_REG(reg, VEPU_REG_DMV_PENALTY_TBL(i / 4), val);

            val = VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                      dmv_qpel_penalty[i], 3);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 1], 2);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 2], 1);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 3], 0);
            H264E_HAL_SET_REG(reg, VEPU_REG_DMV_Q_PIXEL_PENALTY_TBL(i / 4), val);
        }
    }

    /* set buffers addr */
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_LUMA, hw_addr->orig[0]);
    if (hw_offset->offset_byte[0])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_LUMA >> 2,
                               hw_offset->offset_byte[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_CB, hw_addr->orig[1]);
    if (hw_offset->offset_byte[1])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_CB >> 2,
                               hw_offset->offset_byte[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_CR, hw_addr->orig[2]);
    if (hw_offset->offset_byte[2])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_CR >> 2,
                               hw_offset->offset_byte[2]);

    MppBuffer nal_size_table = h264e_vepu_buf_get_nal_size_table(hw_bufs);
    RK_S32 nal_size_table_fd = nal_size_table ? mpp_buffer_get_fd(nal_size_table) : 0;

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_OUTPUT_CTRL, nal_size_table_fd);

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REC_LUMA,   hw_addr->recn[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REC_CHROMA, hw_addr->recn[1]);
    mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_REC_CHROMA >> 2, hw_bufs->yuv_size);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REF_LUMA,   hw_addr->refr[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REF_CHROMA, hw_addr->refr[1]);
    mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_REF_CHROMA >> 2, hw_bufs->yuv_size);

    /* set important encode mode info */
    val = VEPU_REG_MB_HEIGHT(mb_h)
          | VEPU_REG_MB_WIDTH(mb_w)
          | VEPU_REG_PIC_TYPE(slice->idr_flag)
          | VEPU_REG_ENCODE_FORMAT(3)
          | VEPU_REG_ENCODE_ENABLE;
    H264E_HAL_SET_REG(reg, VEPU_REG_ENCODE_START, val);

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}